

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool __thiscall
ON_RTree::InsertRectRec
          (ON_RTree *this,ON_RTreeBBox *a_rect,ON__INT_PTR a_id,ON_RTreeNode *a_node,
          ON_RTreeNode **a_newNode,int a_level)

{
  double *pdVar1;
  int iVar2;
  ON_RTreeBranch *pOVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ON_RTreeBBox *pOVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ON_RTreeNode *otherNode;
  double local_118;
  ON_RTreeBranch local_108;
  ON_RTreeNode **local_d0;
  ON_RTreeNode *local_c8;
  ON__INT_PTR local_c0;
  ON_RTreeBranch *local_b8;
  ON_RTree *local_b0;
  double local_a8;
  ON_RTreeNode *local_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  if (a_level < a_node->m_level) {
    iVar2 = a_node->m_count;
    if (0 < (long)iVar2) {
      pOVar8 = &a_node->m_branch[0].m_rect;
      uVar6 = 0xffffffff;
      bVar4 = true;
      uVar7 = 0;
      local_118 = -1.0;
      dVar11 = -1.0;
      local_d0 = a_newNode;
      local_c8 = a_node;
      local_c0 = a_id;
      local_b8 = (ON_RTreeBranch *)pOVar8;
      local_b0 = this;
      do {
        local_98 = pOVar8->m_min[0];
        uStack_90 = 0;
        local_88 = pOVar8->m_min[1];
        uStack_80 = 0;
        local_78 = pOVar8->m_min[2];
        uStack_70 = 0;
        local_68 = pOVar8->m_max[0];
        uStack_60 = 0;
        local_58 = pOVar8->m_max[1];
        uStack_50 = 0;
        local_48 = pOVar8->m_max[2];
        uStack_40 = 0;
        local_a8 = dVar11;
        CombineRectHelper(&local_108.m_rect,a_rect,pOVar8);
        this = local_b0;
        pOVar3 = local_b8;
        dVar10 = (local_48 - local_78) * (local_48 - local_78) +
                 (local_58 - local_88) * (local_58 - local_88) +
                 (local_68 - local_98) * (local_68 - local_98);
        dVar9 = ((local_108.m_rect.m_max[2] - local_108.m_rect.m_min[2]) *
                 (local_108.m_rect.m_max[2] - local_108.m_rect.m_min[2]) +
                (local_108.m_rect.m_max[1] - local_108.m_rect.m_min[1]) *
                (local_108.m_rect.m_max[1] - local_108.m_rect.m_min[1]) +
                (local_108.m_rect.m_max[0] - local_108.m_rect.m_min[0]) *
                (local_108.m_rect.m_max[0] - local_108.m_rect.m_min[0])) - dVar10;
        if ((bVar4) || (dVar9 < local_a8)) {
LAB_005a82b3:
          uVar6 = uVar7 & 0xffffffff;
          dVar11 = dVar9;
          local_118 = dVar10;
        }
        else {
          dVar11 = local_a8;
          if ((dVar9 == local_a8) && ((!NAN(dVar9) && !NAN(local_a8) && (dVar10 <= local_118))))
          goto LAB_005a82b3;
        }
        uVar7 = uVar7 + 1;
        pOVar8 = (ON_RTreeBBox *)(pOVar8[1].m_min + 1);
        bVar4 = false;
      } while ((long)iVar2 != uVar7);
      if (-1 < (int)uVar6) {
        pOVar8 = &local_b8[uVar6].m_rect;
        bVar4 = InsertRectRec(local_b0,a_rect,local_c0,local_b8[uVar6].field_1.m_child,&local_a0,
                              a_level);
        if (bVar4) {
          NodeCover(&local_108.m_rect,(ON_RTreeNode *)pOVar8[1].m_min[0]);
          pOVar8->m_max[1] = local_108.m_rect.m_max[1];
          pOVar8->m_max[2] = local_108.m_rect.m_max[2];
          pOVar8->m_min[2] = local_108.m_rect.m_min[2];
          pOVar8->m_max[0] = local_108.m_rect.m_max[0];
          pOVar8->m_min[0] = local_108.m_rect.m_min[0];
          pOVar8->m_min[1] = local_108.m_rect.m_min[1];
          local_108.field_1.m_child = local_a0;
          NodeCover(&local_108.m_rect,local_a0);
          lVar5 = (long)local_c8->m_count;
          a_newNode = local_d0;
          a_node = local_c8;
          if (5 < lVar5) goto LAB_005a83be;
          pOVar3[lVar5].field_1.m_child = (ON_RTreeNode *)local_108.field_1;
          pdVar1 = pOVar3[lVar5].m_rect.m_max + 1;
          *pdVar1 = local_108.m_rect.m_max[1];
          pdVar1[1] = local_108.m_rect.m_max[2];
          pdVar1 = pOVar3[lVar5].m_rect.m_min + 2;
          *pdVar1 = local_108.m_rect.m_min[2];
          pdVar1[1] = local_108.m_rect.m_max[0];
          pOVar3[lVar5].m_rect.m_min[0] = local_108.m_rect.m_min[0];
          pOVar3[lVar5].m_rect.m_min[1] = local_108.m_rect.m_min[1];
          local_c8->m_count = local_c8->m_count + 1;
        }
        else {
          CombineRectHelper(&local_108.m_rect,a_rect,pOVar8);
          pOVar8->m_max[1] = local_108.m_rect.m_max[1];
          pOVar8->m_max[2] = local_108.m_rect.m_max[2];
          pOVar8->m_min[2] = local_108.m_rect.m_min[2];
          pOVar8->m_max[0] = local_108.m_rect.m_max[0];
          pOVar8->m_min[0] = local_108.m_rect.m_min[0];
          pOVar8->m_min[1] = local_108.m_rect.m_min[1];
        }
      }
    }
  }
  else {
    if (a_node->m_level != a_level) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
                 ,0xb03,"","ON_RTree::InsertRectRec - bug in algorithm");
      return false;
    }
    local_108.m_rect.m_min[0] = a_rect->m_min[0];
    local_108.m_rect.m_min[1] = a_rect->m_min[1];
    local_108.m_rect.m_min[2] = a_rect->m_min[2];
    local_108.m_rect.m_max[0] = a_rect->m_max[0];
    local_108.m_rect.m_max[1] = a_rect->m_max[1];
    local_108.m_rect.m_max[2] = a_rect->m_max[2];
    lVar5 = (long)a_node->m_count;
    local_108.field_1.m_id = a_id;
    if (5 < lVar5) {
LAB_005a83be:
      SplitNode(this,a_node,&local_108,a_newNode);
      return true;
    }
    a_node->m_branch[lVar5].field_1.m_id = a_id;
    pdVar1 = a_node->m_branch[lVar5].m_rect.m_max + 1;
    *pdVar1 = local_108.m_rect.m_max[1];
    pdVar1[1] = local_108.m_rect.m_max[2];
    pdVar1 = a_node->m_branch[lVar5].m_rect.m_min + 2;
    *pdVar1 = local_108.m_rect.m_min[2];
    pdVar1[1] = local_108.m_rect.m_max[0];
    a_node->m_branch[lVar5].m_rect.m_min[0] = local_108.m_rect.m_min[0];
    a_node->m_branch[lVar5].m_rect.m_min[1] = local_108.m_rect.m_min[1];
    a_node->m_count = a_node->m_count + 1;
  }
  return false;
}

Assistant:

bool ON_RTree::InsertRectRec(ON_RTreeBBox* a_rect, ON__INT_PTR a_id, ON_RTreeNode* a_node, ON_RTreeNode** a_newNode, int a_level)
{
  int index;
  ON_RTreeBranch branch;
  ON_RTreeNode* otherNode;

  // Still above level for insertion, go down tree recursively
  if(a_node->m_level > a_level)
  {
    index = PickBranch(a_rect, a_node);
    if ( index < 0 )
    {
      return false;
    }
    if (!InsertRectRec(a_rect, a_id, a_node->m_branch[index].m_child, &otherNode, a_level))
    {
      // Child was not split
      a_node->m_branch[index].m_rect = CombineRectHelper(a_rect, &(a_node->m_branch[index].m_rect));
      return false;
    }
    else // Child was split
    {
      a_node->m_branch[index].m_rect = NodeCover(a_node->m_branch[index].m_child);
      branch.m_child = otherNode;
      branch.m_rect = NodeCover(otherNode);
      return AddBranch(&branch, a_node, a_newNode);
    }
  }
  else if(a_node->m_level == a_level) // Have reached level for insertion. Add rect, split if necessary
  {
    branch.m_rect = *a_rect;

    // The (ON_RTreeNode*) cast is safe because ON__INT_PTR == sizeof(void*)
#if defined(ON_COMPILER_MSC) && 4 == ON_SIZEOF_POINTER
#pragma ON_PRAGMA_WARNING_PUSH
// Disable warning C4312: 'type cast' : conversion from 'ON__INT_PTR' to 'ON_RTreeNode *' of greater size
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4312 )
#endif
    branch.m_child = (ON_RTreeNode*)a_id;
#if defined(ON_COMPILER_MSC) && 4 == ON_SIZEOF_POINTER
#pragma ON_PRAGMA_WARNING_POP
#endif

    // Child field of leaves contains id of data record
    return AddBranch(&branch, a_node, a_newNode);
  }

  // We should never get here
  ON_ERROR("ON_RTree::InsertRectRec - bug in algorithm");
  return false;
}